

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  uVar1 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar1 != 5) {
    if (uVar1 == 8) {
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                    ,0x4f2,"void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *)");
    }
    if (uVar1 == 3) {
      __assert_fail("!Abc_ObjIsPo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretMain.c"
                    ,0x4f1,"void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *)");
    }
    iVar2 = Abc_NodeIsTravIdCurrent(pObj);
    if (iVar2 == 0) {
      Abc_NodeSetTravIdCurrent(pObj);
      if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
        iVar2 = Abc_FlowRetime_GetLag(pObj);
        Abc_FlowRetime_SetLag(pObj,iVar2 + 1);
      }
      for (lVar3 = 0; lVar3 < (pObj->vFanouts).nSize; lVar3 = lVar3 + 1) {
        Abc_FlowRetime_UpdateLags_back_rec
                  ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]]);
      }
    }
  }
  return;
}

Assistant:

void
Abc_FlowRetime_UpdateLags_back_rec( Abc_Obj_t *pObj ) {
  Abc_Obj_t *pNext;
  int i;

  assert(!Abc_ObjIsPo(pObj));
  assert(!Abc_ObjIsLatch(pObj));

  if (Abc_ObjIsBo(pObj)) return;
  if (Abc_NodeIsTravIdCurrent(pObj)) return;

  Abc_NodeSetTravIdCurrent(pObj);

  if (Abc_ObjIsNode(pObj)) {
    Abc_FlowRetime_SetLag( pObj, 1+Abc_FlowRetime_GetLag(pObj) );
  }

  Abc_ObjForEachFanout( pObj, pNext, i ) {
    Abc_FlowRetime_UpdateLags_back_rec( pNext );
  }
}